

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

int ON_SubDComponentAndNumber::CompareComponentAndDirection
              (ON_SubDComponentAndNumber *a,ON_SubDComponentAndNumber *b)

{
  ON_SubDComponentAndNumber *b_local;
  ON_SubDComponentAndNumber *a_local;
  
  if (a == b) {
    a_local._4_4_ = 0;
  }
  else if (a == (ON_SubDComponentAndNumber *)0x0) {
    a_local._4_4_ = -1;
  }
  else if (b == (ON_SubDComponentAndNumber *)0x0) {
    a_local._4_4_ = 1;
  }
  else {
    a_local._4_4_ = ON_SubDComponentPtr::CompareComponentAndDirection(&a->m_cptr,&b->m_cptr);
  }
  return a_local._4_4_;
}

Assistant:

int ON_SubDComponentAndNumber::CompareComponentAndDirection(
  const ON_SubDComponentAndNumber* a,
  const ON_SubDComponentAndNumber* b
)
{
  if (a == b)
    return 0;
  if (nullptr == a)
    return -1;
  if (nullptr == b)
    return 1;
  return ON_SubDComponentPtr::CompareComponentAndDirection(&a->m_cptr, &b->m_cptr);
}